

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_region.cpp
# Opt level: O0

void __thiscall
Region_OneLargeOneSmallRegionReadOnly_Test::~Region_OneLargeOneSmallRegionReadOnly_Test
          (Region_OneLargeOneSmallRegionReadOnly_Test *this)

{
  Region_OneLargeOneSmallRegionReadOnly_Test *this_local;
  
  ~Region_OneLargeOneSmallRegionReadOnly_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (Region, OneLargeOneSmallRegionReadOnly) {
    constexpr std::size_t big_region_size = 32;
    constexpr std::size_t small_region_size = 16;
    constexpr std::size_t file_size = big_region_size + small_region_size;

    auto sp = this->make_array (file_size);
    auto file =
        std::make_shared<pstore::file::in_memory> (sp, file_size, file_size, false /*writable*/);

    pstore::region::mem_based_factory factory (file, big_region_size, small_region_size);
    auto result = factory.init ();
    ASSERT_EQ (2U, result.size ()) << "The region factory did not return exactly 2 regions";
    {
        auto const & region0 = *(result.at (0));

        EXPECT_EQ (sp, region0.data ());
        EXPECT_EQ (0U, region0.offset ());
        EXPECT_EQ (big_region_size, region0.size ());
        EXPECT_FALSE (region0.is_writable ());
    }
    {
        auto const & region1 = *(result.at (1));
        std::uint8_t const * expected = sp.get () + big_region_size;
        void const * actual = region1.data ().get ();

        EXPECT_EQ (expected, actual);
        EXPECT_EQ (big_region_size, region1.offset ());
        EXPECT_EQ (small_region_size, region1.size ());
        EXPECT_FALSE (region1.is_writable ())
            << "The 2nd region of 2 should not be writable because the file is not writable";
    }
}